

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

void __thiscall
cpp_client::Any::Any<std::__cxx11::string>
          (Any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  holder hVar2;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var3;
  
  _Var3._M_head_impl = (holder *)operator_new(0x28);
  (_Var3._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder2_0013a268;
  _Var3._M_head_impl[1]._vptr_holder = (_func_int **)(_Var3._M_head_impl + 3);
  hVar2._vptr_holder = (_func_int **)(other->_M_dataplus)._M_p;
  paVar1 = &other->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hVar2._vptr_holder == paVar1) {
    hVar2._vptr_holder = *(_func_int ***)((long)&other->field_2 + 8);
    _Var3._M_head_impl[3] = (_func_int **)paVar1->_M_allocated_capacity;
    _Var3._M_head_impl[4]._vptr_holder = hVar2._vptr_holder;
  }
  else {
    _Var3._M_head_impl[1]._vptr_holder = hVar2._vptr_holder;
    _Var3._M_head_impl[3]._vptr_holder = (_func_int **)paVar1->_M_allocated_capacity;
  }
  _Var3._M_head_impl[2]._vptr_holder = (_func_int **)other->_M_string_length;
  (other->_M_dataplus)._M_p = (pointer)paVar1;
  other->_M_string_length = 0;
  (other->field_2)._M_local_buf[0] = '\0';
  (this->data_)._M_t.
  super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>._M_t
  .super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>.
  super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var3._M_head_impl;
  return;
}

Assistant:

Any(T&& other) noexcept :
      data_(new holder2<T>(std::forward<T>(other)))
   {
      ;
   }